

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O2

int size_tToString(char *destination,size_t destinationSize,size_t value)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  iVar2 = 0x32e;
  if (1 < destinationSize && destination != (char *)0x0) {
    uVar3 = 1;
    do {
      uVar6 = uVar3;
      uVar4 = value;
      destination[uVar6 - 1] = (byte)(uVar4 % 10) | 0x30;
      if (uVar4 < 10) break;
      value = uVar4 / 10;
      uVar3 = uVar6 + 1;
    } while (uVar6 < destinationSize - 1);
    iVar2 = 0x34b;
    if (uVar4 < 10) {
      destination[uVar6] = '\0';
      uVar6 = uVar6 - 1;
      uVar3 = uVar6 >> 1;
      iVar2 = 0;
      for (lVar5 = 0; uVar3 + 1 != lVar5; lVar5 = lVar5 + 1) {
        cVar1 = destination[lVar5];
        destination[lVar5] = destination[uVar6];
        destination[uVar6] = cVar1;
        uVar6 = uVar6 - 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int size_tToString(char* destination, size_t destinationSize, size_t value)
{
    int result;
    size_t pos;
    /*the below loop gets the number in reverse order*/
    /*Codes_SRS_CRT_ABSTRACTIONS_02_003: [If destination is NULL then unsignedIntToString shall fail.] */
    /*Codes_SRS_CRT_ABSTRACTIONS_02_002: [If the conversion fails for any reason (for example, insufficient buffer space), a non-zero return value shall be supplied and unsignedIntToString shall fail.] */
    if (
        (destination == NULL) ||
        (destinationSize < 2) /*because the smallest number is '0\0' which requires 2 characters*/
        )
    {
        result = MU_FAILURE;
    }
    else
    {
        pos = 0;
        do
        {
            destination[pos++] = '0' + (value % 10);
            value /= 10;
        } while ((value > 0) && (pos < (destinationSize - 1)));

        if (value == 0)
        {
            size_t w;
            destination[pos] = '\0';
            /*all converted and they fit*/
            for (w = 0; w <= (pos - 1) >> 1; w++)
            {
                char temp;
                temp = destination[w];
                destination[w] = destination[pos - 1 - w];
                destination[pos - 1 - w] = temp;
            }
            /*Codes_SRS_CRT_ABSTRACTIONS_02_004: [If the conversion has been successfull then unsignedIntToString shall return 0.] */
            result = 0;
        }
        else
        {
            /*Codes_SRS_CRT_ABSTRACTIONS_02_002: [If the conversion fails for any reason (for example, insufficient buffer space), a non-zero return value shall be supplied and unsignedIntToString shall fail.] */
            result = MU_FAILURE;
        }
    }
    return result;
}